

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

size_t mi_segment_calculate_slices(size_t required,size_t *info_slices)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = _mi_os_page_size();
  uVar2 = sVar1 + 0xc17f;
  if ((sVar1 & sVar1 - 1) == 0) {
    uVar2 = uVar2 & -sVar1;
  }
  else {
    uVar2 = uVar2 - uVar2 % sVar1;
  }
  if (info_slices != (size_t *)0x0) {
    *info_slices = uVar2 + 0xffff >> 0x10;
  }
  sVar1 = 0x200;
  if (required != 0) {
    sVar1 = (uVar2 + 0xffff & 0xffffffffffff0000) + required + 0xffff >> 0x10;
  }
  return sVar1;
}

Assistant:

static size_t mi_segment_calculate_slices(size_t required, size_t* info_slices) {
  size_t page_size = _mi_os_page_size();
  size_t isize     = _mi_align_up(sizeof(mi_segment_t), page_size);
  size_t guardsize = 0;

  if (MI_SECURE>0) {
    // in secure mode, we set up a protected page in between the segment info
    // and the page data (and one at the end of the segment)
    guardsize = page_size;
    if (required > 0) {
      required = _mi_align_up(required, MI_SEGMENT_SLICE_SIZE) + page_size;
    }
  }

  isize = _mi_align_up(isize + guardsize, MI_SEGMENT_SLICE_SIZE);
  if (info_slices != NULL) *info_slices = isize / MI_SEGMENT_SLICE_SIZE;
  size_t segment_size = (required==0 ? MI_SEGMENT_SIZE : _mi_align_up( required + isize + guardsize, MI_SEGMENT_SLICE_SIZE) );
  mi_assert_internal(segment_size % MI_SEGMENT_SLICE_SIZE == 0);
  return (segment_size / MI_SEGMENT_SLICE_SIZE);
}